

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msc.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
msc::
mean_shift<double,__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,msc::metrics::L2Sq,msc::kernels::ParabolicSq,msc::estimators::Constant>
          (double *param_1,vector<double,_std::allocator<double>_> *__return_storage_ptr__,msc *this
          ,vector<double,_std::allocator<double>_> *point,
          vector<double,_std::allocator<double>_> *first,int param_6)

{
  double dVar1;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  _Var2;
  bool bVar3;
  invalid_argument *this_00;
  reference point_00;
  double *a;
  size_type sVar4;
  reference pvVar5;
  double dVar6;
  double dVar7;
  ulong local_b0;
  size_t k_1;
  ulong local_a0;
  size_t k;
  double weight;
  double dist;
  double *pt;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  it;
  double total_weight;
  double ibw;
  int local_3c;
  msc *pmStack_38;
  int dim_local;
  double *point_local;
  Constant estimator_local;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  local_20;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  last_local;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  first_local;
  vector<double,_std::allocator<double>_> *shifted;
  
  local_3c = param_6;
  pmStack_38 = this;
  point_local = param_1;
  local_20._M_current = first;
  last_local._M_current = point;
  if (0 < param_6) {
    ibw._3_1_ = 0;
    std::allocator<double>::allocator((allocator<double> *)((long)&ibw + 2));
    std::vector<double,_std::allocator<double>_>::vector
              (__return_storage_ptr__,(long)param_6,(allocator<double> *)((long)&ibw + 2));
    std::allocator<double>::~allocator((allocator<double> *)((long)&ibw + 2));
    dVar6 = estimators::Constant::operator()
                      ((Constant *)&point_local,pmStack_38,last_local._M_current,local_20._M_current
                       ,local_3c);
    it._M_current = (vector<double,_std::allocator<double>_> *)0x0;
    pt = (double *)last_local._M_current;
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                               *)&pt,&local_20), bVar3) {
      point_00 = __gnu_cxx::
                 __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                              *)&pt);
      a = Accessor<double,_std::vector<double,_std::allocator<double>_>_>::data(point_00);
      dVar7 = metrics::L2Sq::operator()
                        ((L2Sq *)((long)&estimator_local.factor_ + 7),a,(double *)pmStack_38,
                         local_3c);
      dVar7 = kernels::ParabolicSq::operator()
                        ((ParabolicSq *)((long)&estimator_local.factor_ + 6),dVar7 * dVar6);
      for (local_a0 = 0;
          sVar4 = std::vector<double,_std::allocator<double>_>::size(__return_storage_ptr__),
          local_a0 < sVar4; local_a0 = local_a0 + 1) {
        dVar1 = a[local_a0];
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (__return_storage_ptr__,local_a0);
        *pvVar5 = dVar1 * dVar7 + *pvVar5;
      }
      it._M_current = (vector<double,_std::allocator<double>_> *)(dVar7 + (double)it._M_current);
      __gnu_cxx::
      __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
      ::operator++((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&pt,0);
    }
    for (local_b0 = 0;
        sVar4 = std::vector<double,_std::allocator<double>_>::size(__return_storage_ptr__),
        _Var2 = it, local_b0 < sVar4; local_b0 = local_b0 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (__return_storage_ptr__,local_b0);
      *pvVar5 = *pvVar5 / (double)_Var2._M_current;
    }
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Dimension must be greater than 0");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline std::vector<T> mean_shift(const T* point,
    ForwardIterator first, ForwardIterator last, int dim,
    Metric metric, Kernel kernel, Estimator estimator)
{
    if (dim <= 0)
        throw std::invalid_argument("Dimension must be greater than 0");
    typedef typename std::iterator_traits<ForwardIterator>::value_type C;

    std::vector<T> shifted(dim);
    const auto ibw = estimator(point, first, last, dim, metric);
    double total_weight = 0;

    for (auto it = first; it != last; it++)
    {
        const T* pt = Accessor<T, C>::data(*it);
        const auto dist = metric(pt, point, dim);
        const auto weight = kernel(dist * ibw);
        for (std::size_t k = 0; k < shifted.size(); k++)
            shifted[k] += pt[k] * weight;
        total_weight += weight;
    }

    for (std::size_t k = 0; k < shifted.size(); k++)
        shifted[k] /= total_weight;

    return shifted;
}